

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

JumpStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::JumpStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  JumpStatementSyntax *this_00;
  
  this_00 = (JumpStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((JumpStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (JumpStatementSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar3 = args_2->kind;
  uVar4 = args_2->field_0x2;
  NVar5.raw = (args_2->numFlags).raw;
  uVar6 = args_2->rawLen;
  pIVar1 = args_2->info;
  TVar7 = args_3->kind;
  uVar8 = args_3->field_0x2;
  NVar9.raw = (args_3->numFlags).raw;
  uVar10 = args_3->rawLen;
  pIVar2 = args_3->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,JumpStatement,*args,args_1);
  (this_00->breakOrContinue).kind = TVar3;
  (this_00->breakOrContinue).field_0x2 = uVar4;
  (this_00->breakOrContinue).numFlags = (NumericTokenFlags)NVar5.raw;
  (this_00->breakOrContinue).rawLen = uVar6;
  (this_00->breakOrContinue).info = pIVar1;
  (this_00->semi).kind = TVar7;
  (this_00->semi).field_0x2 = uVar8;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (this_00->semi).rawLen = uVar10;
  (this_00->semi).info = pIVar2;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }